

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

pair<bool,_bool> kratos::correct_port_direction(Port *port1,Port *port2,Generator *top)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  PortDirection PVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bool local_f9;
  bool local_e1;
  bool local_b7;
  bool local_b6;
  bool local_b5;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  byte local_b1;
  enable_shared_from_this<kratos::Generator> local_b0;
  bool local_9b;
  bool local_9a;
  byte local_99;
  enable_shared_from_this<kratos::Generator> local_98;
  undefined4 local_88;
  bool local_83;
  bool local_82;
  undefined1 local_81;
  InterfaceRef *pIStack_80;
  bool dir_in;
  InterfaceRef *it_1;
  InterfacePort *port_i_1;
  InterfaceRef *it;
  InterfacePort *port_i;
  byte local_49;
  undefined1 local_48 [7];
  bool interface_port_wire;
  shared_ptr<kratos::AssignStmt> stmt;
  Generator *parent2;
  Generator *parent1;
  Generator *top_local;
  Port *port2_local;
  Port *port1_local;
  Generator *pGVar6;
  
  iVar2 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0xd])();
  pGVar6 = (Generator *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0xd])();
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var_00,iVar2);
  std::shared_ptr<kratos::AssignStmt>::shared_ptr((shared_ptr<kratos::AssignStmt> *)local_48);
  if ((pGVar6 == (Generator *)
                 stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi) && (pGVar6 == top)) {
    local_49 = 0;
    uVar3 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])();
    if (((uVar3 & 1) == 0) ||
       (uVar3 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])(), (uVar3 & 1) != 0)) {
      uVar3 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])();
      if (((uVar3 & 1) != 0) &&
         (uVar3 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])(), (uVar3 & 1) == 0)) {
        it_1 = (InterfaceRef *)port2;
        pIStack_80 = InterfacePort::interface((InterfacePort *)port2);
        bVar1 = InterfaceRef::is_port(pIStack_80);
        local_49 = (bVar1 ^ 0xffU) & 1;
      }
    }
    else {
      it = (InterfaceRef *)port1;
      port_i_1 = (InterfacePort *)InterfacePort::interface((InterfacePort *)port1);
      bVar1 = InterfaceRef::is_port((InterfaceRef *)port_i_1);
      local_49 = (bVar1 ^ 0xffU) & 1;
    }
    check_direction(port1,port2,(bool)(local_49 & 1));
    PVar4 = Port::port_direction(port1);
    local_81 = PVar4 == In;
    local_82 = (local_49 & 1) == local_81;
    local_83 = true;
    std::pair<bool,_bool>::pair<bool,_bool,_true>
              ((pair<bool,_bool> *)((long)&port1_local + 6),&local_82,&local_83);
  }
  else {
    local_99 = 0;
    local_e1 = false;
    if (pGVar6 == top) {
      std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_98);
      local_99 = 1;
      local_e1 = Generator::has_child_generator(top,(shared_ptr<kratos::Generator> *)&local_98);
    }
    if ((local_99 & 1) != 0) {
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_98);
    }
    if (local_e1 == false) {
      local_b1 = 0;
      local_f9 = false;
      if ((Generator *)
          stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == top) {
        std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_b0);
        local_b1 = 1;
        local_f9 = Generator::has_child_generator(top,(shared_ptr<kratos::Generator> *)&local_b0);
      }
      if ((local_b1 & 1) != 0) {
        std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_b0);
      }
      if (local_f9 == false) {
        iVar2 = (*(pGVar6->super_IRNode)._vptr_IRNode[4])();
        iVar5 = (*(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base[4])();
        if ((CONCAT44(extraout_var_01,iVar2) == CONCAT44(extraout_var_02,iVar5)) &&
           (iVar2 = (*(pGVar6->super_IRNode)._vptr_IRNode[4])(),
           (Generator *)CONCAT44(extraout_var_03,iVar2) == top)) {
          check_direction(port1,port2,false);
          PVar4 = Port::port_direction(port1);
          local_b4 = PVar4 == In;
          local_b5 = true;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&port1_local + 6),&local_b4,&local_b5);
        }
        else {
          local_b6 = false;
          local_b7 = false;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&port1_local + 6),&local_b6,&local_b7);
        }
      }
      else {
        check_direction(port1,port2,true);
        PVar4 = Port::port_direction(port1);
        local_b2 = PVar4 == In;
        local_b3 = true;
        std::pair<bool,_bool>::pair<bool,_bool,_true>
                  ((pair<bool,_bool> *)((long)&port1_local + 6),&local_b2,&local_b3);
      }
    }
    else {
      check_direction(port1,port2,true);
      PVar4 = Port::port_direction(port1);
      local_9a = PVar4 != In;
      local_9b = true;
      std::pair<bool,_bool>::pair<bool,_bool,_true>
                ((pair<bool,_bool> *)((long)&port1_local + 6),&local_9a,&local_9b);
    }
  }
  local_88 = 1;
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_48);
  return port1_local._6_2_;
}

Assistant:

std::pair<bool, bool> correct_port_direction(Port *port1, Port *port2, Generator *top) {
    auto *parent1 = port1->generator();
    auto *parent2 = port2->generator();
    std::shared_ptr<AssignStmt> stmt;
    if (parent1 == parent2 && parent1 == top) {
        // it's the same module
        // by default same direction is fault, however, for modport ones, it is the same direction
        bool interface_port_wire = false;
        if (port1->is_interface() && !port2->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port1);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        } else if (port2->is_interface() && !port1->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port2);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        }
        check_direction(port1, port2, interface_port_wire);
        bool dir_in = port1->port_direction() == PortDirection::In;
        return {(interface_port_wire == dir_in), true};
    } else {
        if (parent1 == top && top->has_child_generator(parent2->shared_from_this())) {
            check_direction(port1, port2, true);
            return {port1->port_direction() != PortDirection::In, true};
        } else if (parent2 == top && top->has_child_generator(parent1->shared_from_this())) {
            check_direction(port1, port2, true);
            return {(port1->port_direction() == PortDirection::In), true};
        } else if (parent1->parent() == parent2->parent() && parent1->parent() == top) {
            check_direction(port1, port2, false);
            return {(port1->port_direction() == PortDirection::In), true};
        } else {
            return {false, false};
        }
    }
}